

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void soul::SanityCheckPass::runPostResolutionChecks(ModuleBase *module)

{
  PostResolutionChecks local_68;
  
  checkOverallStructure(module);
  local_68.recursiveTypeDeclVisitStack.stack.items =
       (TypeDeclarationBase **)local_68.recursiveTypeDeclVisitStack.stack.space;
  local_68.recursiveTypeDeclVisitStack.stack.space[6] = 0;
  local_68.recursiveTypeDeclVisitStack.stack.space[7] = 0;
  local_68.recursiveTypeDeclVisitStack.stack.space[4] = 0;
  local_68.recursiveTypeDeclVisitStack.stack.space[5] = 0;
  local_68.recursiveTypeDeclVisitStack.stack.space[2] = 0;
  local_68.recursiveTypeDeclVisitStack.stack.space[3] = 0;
  local_68.recursiveTypeDeclVisitStack.stack.space[0] = 0;
  local_68.recursiveTypeDeclVisitStack.stack.space[1] = 0;
  local_68.super_ASTVisitor._vptr_ASTVisitor = (_func_int **)&PTR__PostResolutionChecks_00331b58;
  local_68.recursiveTypeDeclVisitStack.stack.numActive = 0;
  local_68.recursiveTypeDeclVisitStack.stack.numAllocated = 8;
  ASTVisitor::visitObject(&local_68.super_ASTVisitor,module);
  PostResolutionChecks::~PostResolutionChecks(&local_68);
  return;
}

Assistant:

static void runPostResolutionChecks (AST::ModuleBase& module)
    {
        checkOverallStructure (module);
        PostResolutionChecks().ASTVisitor::visitObject (module);
    }